

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleCheckOne(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  uint uVar1;
  
  uVar1 = pDiv->HNum * 2;
  if (((int)uVar1 <= p->nItems) && (pDiv->Weight < p->pTree[(int)uVar1]->Weight)) {
    __assert_fail("Weight1 >= Weight2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                  ,0xb4,"void Fxu_HeapDoubleCheckOne(Fxu_HeapDouble *, Fxu_Double *)");
  }
  if (((int)uVar1 < p->nItems) && (pDiv->Weight < p->pTree[(int)(uVar1 | 1)]->Weight)) {
    __assert_fail("Weight1 >= Weight2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                  ,0xba,"void Fxu_HeapDoubleCheckOne(Fxu_HeapDouble *, Fxu_Double *)");
  }
  return;
}

Assistant:

void Fxu_HeapDoubleCheckOne( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    int Weight1, Weight2;
    if ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,pDiv) )
    {
        Weight1 = FXU_HEAP_DOUBLE_WEIGHT(pDiv);
        Weight2 = FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD1(p,pDiv) );
        assert( Weight1 >= Weight2 );
    }
    if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,pDiv) )
    {
        Weight1 = FXU_HEAP_DOUBLE_WEIGHT(pDiv);
        Weight2 = FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD2(p,pDiv) );
        assert( Weight1 >= Weight2 );
    }
}